

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int reparse_unary_expr(lyxp_expr *exp,uint16_t *exp_idx)

{
  ushort repeat_op_idx;
  lyxp_token *plVar1;
  int iVar2;
  uint16_t exp_idx_00;
  
  exp_idx_00 = *exp_idx;
  if (exp->used != exp_idx_00) {
    plVar1 = exp->tokens;
    do {
      if ((plVar1[exp_idx_00] != LYXP_TOKEN_OPERATOR_MATH) ||
         (exp->expr[exp->expr_pos[exp_idx_00]] != '-')) break;
      exp_idx_00 = exp_idx_00 + 1;
      *exp_idx = exp_idx_00;
    } while (exp_idx_00 != exp->used);
  }
  while( true ) {
    iVar2 = reparse_path_expr(exp,exp_idx);
    if (iVar2 != 0) {
      return -1;
    }
    repeat_op_idx = *exp_idx;
    if (exp->used == repeat_op_idx) break;
    if (exp->tokens[repeat_op_idx] != LYXP_TOKEN_OPERATOR_UNI) {
      return 0;
    }
    exp_repeat_push(exp,exp_idx_00,repeat_op_idx);
    exp_idx_00 = *exp_idx + 1;
    *exp_idx = exp_idx_00;
  }
  return 0;
}

Assistant:

static int
reparse_unary_expr(struct lyxp_expr *exp, uint16_t *exp_idx)
{
    uint16_t prev_exp;

    /* ('-')* */
    while (!exp_check_token(exp, *exp_idx, LYXP_TOKEN_OPERATOR_MATH, 0)
            && (exp->expr[exp->expr_pos[*exp_idx]] == '-')) {
        ++(*exp_idx);
    }

    /* PathExpr */
    prev_exp = *exp_idx;
    if (reparse_path_expr(exp, exp_idx)) {
        return -1;
    }

    /* ('|' PathExpr)* */
    while (!exp_check_token(exp, *exp_idx, LYXP_TOKEN_OPERATOR_UNI, 0)) {
        exp_repeat_push(exp, prev_exp, *exp_idx);
        ++(*exp_idx);

        prev_exp = *exp_idx;
        if (reparse_path_expr(exp, exp_idx)) {
            return -1;
        }
    }

    return EXIT_SUCCESS;
}